

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_swipe.cc
# Opt level: O3

void __thiscall
sptk::PitchExtractionBySwipe::PitchExtractionBySwipe
          (PitchExtractionBySwipe *this,int frame_shift,double sampling_rate,double lower_f0,
          double upper_f0,double voicing_threshold)

{
  (this->super_PitchExtractionInterface)._vptr_PitchExtractionInterface =
       (_func_int **)&PTR__PitchExtractionInterface_00135b90;
  this->frame_shift_ = frame_shift;
  this->sampling_rate_ = sampling_rate;
  this->lower_f0_ = lower_f0;
  this->upper_f0_ = upper_f0;
  this->voicing_threshold_ = voicing_threshold;
  this->is_valid_ = true;
  if ((((0 < frame_shift) && (sampling_rate <= 98000.0)) && (6000.0 < sampling_rate)) &&
     (((upper_f0 < sampling_rate * 0.5 && (10.0 < lower_f0)) && (lower_f0 < upper_f0)))) {
    return;
  }
  this->is_valid_ = false;
  return;
}

Assistant:

PitchExtractionBySwipe::PitchExtractionBySwipe(int frame_shift,
                                               double sampling_rate,
                                               double lower_f0, double upper_f0,
                                               double voicing_threshold)
    : frame_shift_(frame_shift),
      sampling_rate_(sampling_rate),
      lower_f0_(lower_f0),
      upper_f0_(upper_f0),
      voicing_threshold_(voicing_threshold),
      is_valid_(true) {
  if (frame_shift_ <= 0 || sampling_rate_ / 2 <= upper_f0_ ||
      (sampling_rate_ <= 6000.0 || 98000.0 < sampling_rate_) ||
      (lower_f0_ <= 10.0 || upper_f0_ <= lower_f0_)) {
    is_valid_ = false;
    return;
  }
}